

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t zesGetPowerProcAddrTable(ze_api_version_t version,zes_power_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnPowerGetProperties_t p_Var3;
  zes_pfnPowerGetEnergyCounter_t p_Var4;
  zes_pfnPowerGetLimits_t p_Var5;
  zes_pfnPowerSetLimits_t p_Var6;
  zes_pfnPowerGetEnergyThreshold_t p_Var7;
  zes_pfnPowerSetEnergyThreshold_t p_Var8;
  zes_pfnPowerSetLimitsExt_t p_Var9;
  bool bVar10;
  int iVar11;
  ze_result_t zVar12;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar13;
  
  puVar13 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 == puVar13) {
LAB_001bf7e8:
    zVar12 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zes_power_dditable_t *)0x0) {
    zVar12 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar12 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= *(int *)(loader::context + 0x15c0)) {
      bVar10 = false;
      do {
        while ((*(int *)(puVar13 + 1) != 0 ||
               (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar13,"zesGetPowerProcAddrTable"),
               UNRECOVERED_JUMPTABLE == (code *)0x0))) {
LAB_001bf727:
          puVar13 = puVar13 + 0x1b3;
          if (puVar13 == puVar1) {
            if (!bVar10) goto LAB_001bf7e8;
            goto LAB_001bf75a;
          }
        }
        iVar11 = (*UNRECOVERED_JUMPTABLE)(version,puVar13 + 0x156);
        if (iVar11 != 0) {
          *(int *)(puVar13 + 1) = iVar11;
          goto LAB_001bf727;
        }
        puVar13 = puVar13 + 0x1b3;
        bVar10 = true;
      } while (puVar13 != puVar1);
LAB_001bf75a:
      lVar2 = **(long **)(loader::context + 0x1610);
      if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b) <
           2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        p_Var3 = *(zes_pfnPowerGetProperties_t *)(lVar2 + 0xab0);
        p_Var4 = *(zes_pfnPowerGetEnergyCounter_t *)(lVar2 + 0xab8);
        p_Var5 = *(zes_pfnPowerGetLimits_t *)(lVar2 + 0xac0);
        p_Var6 = *(zes_pfnPowerSetLimits_t *)(lVar2 + 0xac8);
        p_Var7 = *(zes_pfnPowerGetEnergyThreshold_t *)(lVar2 + 0xad0);
        p_Var8 = *(zes_pfnPowerSetEnergyThreshold_t *)(lVar2 + 0xad8);
        p_Var9 = *(zes_pfnPowerSetLimitsExt_t *)(lVar2 + 0xae8);
        pDdiTable->pfnGetLimitsExt = *(zes_pfnPowerGetLimitsExt_t *)(lVar2 + 0xae0);
        pDdiTable->pfnSetLimitsExt = p_Var9;
        pDdiTable->pfnGetEnergyThreshold = p_Var7;
        pDdiTable->pfnSetEnergyThreshold = p_Var8;
        pDdiTable->pfnGetLimits = p_Var5;
        pDdiTable->pfnSetLimits = p_Var6;
        pDdiTable->pfnGetProperties = p_Var3;
        pDdiTable->pfnGetEnergyCounter = p_Var4;
      }
      else {
        pDdiTable->pfnGetProperties = loader::zesPowerGetProperties;
        pDdiTable->pfnGetEnergyCounter = loader::zesPowerGetEnergyCounter;
        pDdiTable->pfnGetLimits = loader::zesPowerGetLimits;
        pDdiTable->pfnSetLimits = loader::zesPowerSetLimits;
        pDdiTable->pfnGetEnergyThreshold = loader::zesPowerGetEnergyThreshold;
        pDdiTable->pfnSetEnergyThreshold = loader::zesPowerSetEnergyThreshold;
        pDdiTable->pfnGetLimitsExt = loader::zesPowerGetLimitsExt;
        pDdiTable->pfnSetLimitsExt = loader::zesPowerSetLimitsExt;
      }
      if (*(long *)(loader::context + 0x1618) == 0) {
        zVar12 = ZE_RESULT_SUCCESS;
      }
      else {
        UNRECOVERED_JUMPTABLE =
             (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetPowerProcAddrTable");
        zVar12 = ZE_RESULT_ERROR_UNINITIALIZED;
        if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
          zVar12 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
          return zVar12;
        }
      }
    }
  }
  return zVar12;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetPowerProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_power_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetPowerProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetPowerProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Power);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesPowerGetProperties;
            pDdiTable->pfnGetEnergyCounter                         = loader::zesPowerGetEnergyCounter;
            pDdiTable->pfnGetLimits                                = loader::zesPowerGetLimits;
            pDdiTable->pfnSetLimits                                = loader::zesPowerSetLimits;
            pDdiTable->pfnGetEnergyThreshold                       = loader::zesPowerGetEnergyThreshold;
            pDdiTable->pfnSetEnergyThreshold                       = loader::zesPowerSetEnergyThreshold;
            pDdiTable->pfnGetLimitsExt                             = loader::zesPowerGetLimitsExt;
            pDdiTable->pfnSetLimitsExt                             = loader::zesPowerSetLimitsExt;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Power;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetPowerProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetPowerProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}